

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_broker.cpp
# Opt level: O1

int run_broker(switches *opt)

{
  _Atomic_word *p_Var1;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  not_null<std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_*> this_01;
  not_null<const_char_*> nVar8;
  int iVar9;
  id __tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  unsigned_short *puVar11;
  maybe<pstore::http::server_status,_void> *pmVar12;
  size_t __nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf;
  maybe<pstore::http::server_status,_void> *this_02;
  pointer pcVar13;
  uint uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  undefined8 *puVar15;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  long in_FS_OFFSET;
  atomic<bool> uptime_done;
  message_ptr msg;
  shared_ptr<pstore::broker::command_processor> commands;
  thread quit;
  shared_ptr<pstore::broker::scavenger> scav;
  shared_ptr<pstore::broker::recorder> record_file;
  packaged_task<void_()> task;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futures;
  maybe<pstore::http::server_status,_void> http_status;
  fifo_path fifo;
  undefined1 local_2c9;
  thread local_2c8;
  packaged_task<void_()> local_2c0;
  undefined8 local_2b0;
  undefined1 local_2a8 [32];
  shared_ptr<pstore::broker::command_processor> local_288;
  _Alloc_hider local_278;
  undefined1 local_270 [24];
  recorder *local_258;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_250;
  __native_type local_248 [2];
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_1e8;
  weak_ptr<pstore::broker::scavenger> local_1c8;
  weak_ptr<pstore::broker::command_processor> local_1b8;
  not_null<std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_*> local_1a8;
  atomic<bool> *local_1a0;
  maybe<pstore::http::server_status,_void> local_198;
  string local_158;
  update_callback local_138;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [7];
  not_null<const_char_*> local_90;
  not_null<const_char_*> local_88;
  not_null<const_char_*> local_80;
  not_null<std::atomic<bool>_*> local_78;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> local_70;
  id local_68;
  not_null<std::atomic<bool>_*> local_60;
  not_null<pstore::maybe<pstore::http::server_status,_void>_*> local_58;
  not_null<const_char_*> local_50;
  not_null<const_char_*> local_48;
  not_null<const_char_*> local_40;
  not_null<const_char_*> local_38;
  
  local_38.ptr_ = "main";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_38);
  pstore::threads::set_name(local_38);
  local_118._0_8_ = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"broker.main","");
  pstore::create_log_stream((string *)local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._0_8_ != local_108) {
    operator_delete((void *)local_118._0_8_,local_108[0]._M_allocated_capacity + 1);
  }
  local_40.ptr_ = "broker starting";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_40);
  nVar8.ptr_ = local_40.ptr_;
  pstore::details::log_destinations::__tls_init();
  if (*(long *)(in_FS_OFFSET + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar3 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
    for (puVar15 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8); puVar15 != puVar3;
        puVar15 = puVar15 + 1) {
      (**(code **)(*(long *)*puVar15 + 0x48))((long *)*puVar15,5,nVar8.ptr_);
    }
  }
  local_258 = (recorder *)0x0;
  p_Stack_250 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((opt->record_path).valid_ == true) {
    pbVar10 = pstore::
              maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              ::operator->(&opt->record_path);
    local_118._0_8_ = (recorder *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<pstore::broker::recorder,std::allocator<pstore::broker::recorder>,std::__cxx11::string_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),(recorder **)local_118,
               (allocator<pstore::broker::recorder> *)local_248,pbVar10);
    uVar4 = local_118._8_8_;
    local_258 = (recorder *)local_118._0_8_;
    this_00 = p_Stack_250;
    local_118._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Stack_250 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
  }
  local_48.ptr_ = "opening pipe";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_48);
  nVar8.ptr_ = local_48.ptr_;
  pstore::details::log_destinations::__tls_init();
  if (*(long *)(in_FS_OFFSET + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar3 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
    for (puVar15 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8); puVar15 != puVar3;
        puVar15 = puVar15 + 1) {
      (**(code **)(*(long *)*puVar15 + 0x48))((long *)*puVar15,5,nVar8.ptr_);
    }
  }
  if ((opt->pipe_path).valid_ == true) {
    pbVar10 = pstore::
              maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              ::operator->(&opt->pipe_path);
    pcVar13 = (pbVar10->_M_dataplus)._M_p;
  }
  else {
    pcVar13 = (czstring)0x0;
  }
  local_138.super__Function_base._M_functor._8_8_ = 0;
  local_138.super__Function_base._M_functor._M_unused._M_object =
       pstore::brokerface::fifo_path::default_update_cb;
  local_138._M_invoker =
       std::
       _Function_handler<void_(pstore::brokerface::fifo_path::operation),_void_(*)(pstore::brokerface::fifo_path::operation)>
       ::_M_invoke;
  local_138.super__Function_base._M_manager =
       std::
       _Function_handler<void_(pstore::brokerface::fifo_path::operation),_void_(*)(pstore::brokerface::fifo_path::operation)>
       ::_M_manager;
  pstore::brokerface::fifo_path::fifo_path((fifo_path *)local_118,pcVar13,&local_138);
  if (local_138.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_138.super__Function_base._M_manager)
              ((_Any_data *)&local_138,(_Any_data *)&local_138,__destroy_functor);
  }
  local_1e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278._M_p = (pointer)0x0;
  if ((opt->http_port).valid_ == true) {
    puVar11 = pstore::maybe<unsigned_short,_void>::operator->(&opt->http_port);
    local_198.valid_ = true;
    local_198.storage_.__align =
         (anon_struct_8_0_00000001_for___align)((ulong)(uint)local_198.storage_._4_4_ << 0x20);
    local_198.storage_._48_2_ = *puVar11;
  }
  else {
    local_198.storage_._48_8_ = 0;
    local_198._0_8_ = 0;
    local_198.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  }
  local_198.storage_._40_8_ = 0;
  local_198.storage_._32_8_ = 0;
  local_198.storage_._24_8_ = 0;
  local_198.storage_._16_8_ = 0;
  local_198.storage_._8_8_ = 0;
  local_2c9 = (__atomic_base<bool>)false;
  local_50.ptr_ = "starting threads";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_50);
  nVar8.ptr_ = local_50.ptr_;
  pstore::details::log_destinations::__tls_init();
  if (*(long *)(in_FS_OFFSET + -8) != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar3 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
    for (puVar15 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8); puVar15 != puVar3;
        puVar15 = puVar15 + 1) {
      (**(code **)(*(long *)*puVar15 + 0x48))((long *)*puVar15,5,nVar8.ptr_);
    }
  }
  local_270._16_8_ = &opt->num_read_threads;
  local_2a8._0_8_ = &local_2c9;
  local_288.super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (command_processor *)0x0;
  local_248[0]._0_8_ = &local_198;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::broker::command_processor,std::allocator<pstore::broker::command_processor>,unsigned_int_const&,pstore::maybe<pstore::http::server_status,void>*,std::atomic<bool>*,std::chrono::duration<long,std::ratio<1l,1l>>const&>
            (&local_288.
              super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(command_processor **)(local_2a8 + 0x20),
             (allocator<pstore::broker::command_processor> *)&local_2c0,(uint *)local_270._16_8_,
             (maybe<pstore::http::server_status,_void> **)&local_248[0].__align,
             (atomic<bool> **)local_2a8,&opt->scavenge_time);
  local_270._0_8_ = (scavenger *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::broker::scavenger,std::allocator<pstore::broker::scavenger>,std::shared_ptr<pstore::broker::command_processor>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_270 + 8),(scavenger **)local_270,
             (allocator<pstore::broker::scavenger> *)local_248,
             (shared_ptr<pstore::broker::command_processor> *)(local_2a8 + 0x20));
  pstore::broker::command_processor::atomic_weak_ptr<pstore::broker::scavenger>::set
            ((atomic_weak_ptr<pstore::broker::scavenger> *)
             &((__pthread_internal_list *)
              ((long)local_288.
                     super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + 0x20))->__next,(shared_ptr<pstore::broker::scavenger> *)local_270);
  local_1b8.super___weak_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_288.super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1b8.super___weak_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_288.super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_288.super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_288.super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_288.
            super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_288.super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_288.
            super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  local_1c8.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_270._0_8_;
  local_1c8.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_270._8_8_ + 0xc) = *(_Atomic_word *)(local_270._8_8_ + 0xc) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_270._8_8_ + 0xc) = *(_Atomic_word *)(local_270._8_8_ + 0xc) + 1;
    }
  }
  uVar14 = *(uint *)local_270._16_8_;
  local_58.ptr_ = &local_198;
  pstore::gsl::not_null<pstore::maybe<pstore::http::server_status,_void>_*>::ensure_invariant
            (&local_58);
  local_60.ptr_ = (atomic<bool> *)&local_2c9;
  pstore::gsl::not_null<std::atomic<bool>_*>::ensure_invariant(&local_60);
  pstore::broker::create_quit_thread
            ((broker *)&local_248[0].__data,&local_1b8,&local_1c8,uVar14,local_58,local_60);
  _Var6._M_p = local_278._M_p;
  if ((maybe<pstore::http::server_status,_void> *)local_278._M_p ==
      (maybe<pstore::http::server_status,_void> *)0x0) {
    local_278._M_p = (pointer)local_248[0]._0_8_;
    local_248[0].__align = _Var6._M_p;
    if (local_1c8.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_1c8.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_weak_count;
        iVar9 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar9 = (local_1c8.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_1c8.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (*(local_1c8.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if (local_1b8.super___weak_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_1b8.
                   super___weak_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar9 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar9 = (local_1b8.
                 super___weak_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_1b8.super___weak_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar9 + -1;
      }
      if (iVar9 == 1) {
        (*(local_1b8.super___weak_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    this._M_pi = local_288.
                 super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    peVar5 = local_288.
             super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_1a0 = (atomic<bool> *)&local_2c9;
    local_2a8._0_8_ = (maybe<pstore::http::server_status,_void> *)0x0;
    local_2a8._8_8_ = (maybe<pstore::http::server_status,_void> *)0x0;
    local_2a8._16_8_ = 0;
    if (local_288.super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_288.super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_288.
              super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_288.super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_288.
              super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    pmVar12 = (maybe<pstore::http::server_status,_void> *)operator_new(0x50);
    (pmVar12->storage_).__align = (anon_struct_8_0_00000001_for___align)0x100000001;
    *(undefined ***)pmVar12 = &PTR___Sp_counted_ptr_inplace_00157dd0;
    std::__future_base::_Task_state_base<void()>::_Task_state_base<std::allocator<int>>
              ((_Task_state_base<void()> *)((pmVar12->storage_).__data + 8),
               (allocator<int> *)&local_2c8);
    *(undefined ***)((long)&pmVar12->storage_ + 8) = &PTR___Task_state_00157e20;
    *(undefined1 **)((long)&pmVar12->storage_ + 0x30) = local_118;
    *(element_type **)(pmVar12 + 1) = peVar5;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&pmVar12[1].storage_ = this._M_pi;
    if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this._M_pi)->_M_use_count = (this._M_pi)->_M_use_count + 1;
      }
    }
    local_248[0]._0_8_ =
         (maybe<pstore::http::server_status,_void> *)((pmVar12->storage_).__data + 8);
    local_248[0]._8_8_ = pmVar12;
    std::packaged_task<void_()>::get_future(&local_2c0);
    std::thread::thread<std::packaged_task<void()>,,void>
              (&local_2c8,(packaged_task<void_()> *)&local_248[0].__data);
    std::thread::detach();
    if (local_2c8._M_id._M_thread == 0) {
      std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)&local_248[0].__data);
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,std::allocator<std::future<void>>> *)local_2a8,
                 (future<void> *)&local_2c0);
      if (local_2c0._M_state.
          super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2c0._M_state.
                   super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
      }
      uVar7 = local_270._8_8_;
      uVar4 = local_270._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_270._8_8_ + 8) = *(_Atomic_word *)(local_270._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_270._8_8_ + 8) = *(_Atomic_word *)(local_270._8_8_ + 8) + 1;
        }
      }
      pmVar12 = (maybe<pstore::http::server_status,_void> *)operator_new(0x48);
      (pmVar12->storage_).__align = (anon_struct_8_0_00000001_for___align)0x100000001;
      *(undefined ***)pmVar12 = &PTR___Sp_counted_ptr_inplace_00157ea0;
      std::__future_base::_Task_state_base<void()>::_Task_state_base<std::allocator<int>>
                ((_Task_state_base<void()> *)((pmVar12->storage_).__data + 8),
                 (allocator<int> *)&local_2c8);
      *(undefined ***)((long)&pmVar12->storage_ + 8) = &PTR___Task_state_00157ef0;
      *(undefined8 *)((long)&pmVar12->storage_ + 0x30) = uVar4;
      *(undefined8 *)(pmVar12 + 1) = uVar7;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(uVar7 + 8) = *(_Atomic_word *)(uVar7 + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(uVar7 + 8) = *(_Atomic_word *)(uVar7 + 8) + 1;
        }
      }
      local_248[0]._0_8_ =
           (maybe<pstore::http::server_status,_void> *)((pmVar12->storage_).__data + 8);
      local_248[0]._8_8_ = pmVar12;
      std::packaged_task<void_()>::get_future(&local_2c0);
      std::thread::thread<std::packaged_task<void()>,,void>
                (&local_2c8,(packaged_task<void_()> *)&local_248[0].__data);
      std::thread::detach();
      if (local_2c8._M_id._M_thread == 0) {
        std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)&local_248[0].__data);
        std::vector<std::future<void>,std::allocator<std::future<void>>>::
        emplace_back<std::future<void>>
                  ((vector<std::future<void>,std::allocator<std::future<void>>> *)local_2a8,
                   (future<void> *)&local_2c0);
        if (local_2c0._M_state.
            super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_2c0._M_state.
                     super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
        }
        pmVar12 = (maybe<pstore::http::server_status,_void> *)operator_new(0x40);
        (pmVar12->storage_).__align = (anon_struct_8_0_00000001_for___align)0x100000001;
        *(undefined ***)pmVar12 = &PTR___Sp_counted_ptr_inplace_00157f70;
        std::__future_base::_Task_state_base<void()>::_Task_state_base<std::allocator<int>>
                  ((_Task_state_base<void()> *)((pmVar12->storage_).__data + 8),
                   (allocator<int> *)&local_2c8);
        *(undefined ***)((long)&pmVar12->storage_ + 8) = &PTR___Task_state_00157fc0;
        local_248[0]._0_8_ =
             (maybe<pstore::http::server_status,_void> *)((pmVar12->storage_).__data + 8);
        local_248[0]._8_8_ = pmVar12;
        std::packaged_task<void_()>::get_future(&local_2c0);
        std::thread::thread<std::packaged_task<void()>,,void>
                  (&local_2c8,(packaged_task<void_()> *)&local_248[0].__data);
        std::thread::detach();
        if (local_2c8._M_id._M_thread == 0) {
          std::packaged_task<void_()>::~packaged_task
                    ((packaged_task<void_()> *)&local_248[0].__data);
          std::vector<std::future<void>,std::allocator<std::future<void>>>::
          emplace_back<std::future<void>>
                    ((vector<std::future<void>,std::allocator<std::future<void>>> *)local_2a8,
                     (future<void> *)&local_2c0);
          if (local_2c0._M_state.
              super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_2c0._M_state.
                       super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          pmVar12 = (maybe<pstore::http::server_status,_void> *)operator_new(0x40);
          (pmVar12->storage_).__align = (anon_struct_8_0_00000001_for___align)0x100000001;
          *(undefined ***)pmVar12 = &PTR___Sp_counted_ptr_inplace_00158040;
          std::__future_base::_Task_state_base<void(std::atomic<bool>*const&)>::
          _Task_state_base<std::allocator<int>>
                    ((_Task_state_base<void(std::atomic<bool>*const&)> *)
                     ((pmVar12->storage_).__data + 8),(allocator<int> *)&local_2c8);
          *(undefined ***)((long)&pmVar12->storage_ + 8) = &PTR___Task_state_00158090;
          local_248[0]._0_8_ =
               (maybe<pstore::http::server_status,_void> *)((pmVar12->storage_).__data + 8);
          local_248[0]._8_8_ = pmVar12;
          std::packaged_task<void_(std::atomic<bool>_*const_&)>::get_future
                    ((packaged_task<void_(std::atomic<bool>_*const_&)> *)&local_2c0);
          std::thread::
          thread<std::packaged_task<void(std::atomic<bool>*const&)>,std::atomic<bool>*const&,void>
                    (&local_2c8,
                     (packaged_task<void_(std::atomic<bool>_*const_&)> *)&local_248[0].__data,
                     &local_1a0);
          std::thread::detach();
          if (local_2c8._M_id._M_thread == 0) {
            std::packaged_task<void_(std::atomic<bool>_*const_&)>::~packaged_task
                      ((packaged_task<void_(std::atomic<bool>_*const_&)> *)&local_248[0].__data);
            std::vector<std::future<void>,std::allocator<std::future<void>>>::
            emplace_back<std::future<void>>
                      ((vector<std::future<void>,std::allocator<std::future<void>>> *)local_2a8,
                       (future<void> *)&local_2c0);
            if (local_2c0._M_state.
                super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_2c0._M_state.
                         super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            local_248[0]._16_8_ =
                 local_1e8.
                 super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_248[0]._8_8_ =
                 local_1e8.
                 super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_248[0]._0_8_ =
                 local_1e8.
                 super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
            __nbytes = local_2a8._16_8_;
            local_1e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_2a8._0_8_;
            local_1e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_2a8._8_8_;
            local_1e8.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2a8._16_8_;
            local_2a8._0_8_ = (maybe<pstore::http::server_status,_void> *)0x0;
            local_2a8._8_8_ = (maybe<pstore::http::server_status,_void> *)0x0;
            local_2a8._16_8_ = 0;
            std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                      ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                       &local_248[0].__data);
            std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                      ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_2a8);
            local_1a8.ptr_ =
                 (vector<std::future<void>,_std::allocator<std::future<void>_>_> *)&local_1e8;
            pstore::gsl::
            not_null<std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_*>::
            ensure_invariant(&local_1a8);
            local_68._M_thread = (native_handle_type)&local_198;
            pstore::gsl::not_null<pstore::maybe<pstore::http::server_status,_void>_*>::
            ensure_invariant((not_null<pstore::maybe<pstore::http::server_status,_void>_*> *)
                             &local_68);
            this_01.ptr_ = local_1a8.ptr_;
            if (*(char *)local_68._M_thread == '\x01') {
              bVar2 = opt->announce_http_port;
              local_2c8._M_id._M_thread = (id)(id)local_68._M_thread;
              pmVar12 = (maybe<pstore::http::server_status,_void> *)operator_new(0x40);
              (pmVar12->storage_).__align = (anon_struct_8_0_00000001_for___align)0x100000001;
              *(undefined ***)pmVar12 = &PTR___Sp_counted_ptr_inplace_00158110;
              std::__future_base::
              _Task_state_base<void(pstore::maybe<pstore::http::server_status,void>*)>::
              _Task_state_base<std::allocator<int>>
                        ((_Task_state_base<void(pstore::maybe<pstore::http::server_status,void>*)> *
                         )((pmVar12->storage_).__data + 8),(allocator<int> *)&local_2c0);
              *(undefined ***)((long)&pmVar12->storage_ + 8) = &PTR___Task_state_00158160;
              (pmVar12->storage_).__data[0x30] = bVar2;
              local_248[0]._0_8_ =
                   (maybe<pstore::http::server_status,_void> *)((pmVar12->storage_).__data + 8);
              local_248[0]._8_8_ = pmVar12;
              std::packaged_task<void_(pstore::maybe<pstore::http::server_status,_void>_*)>::
              get_future((packaged_task<void_(pstore::maybe<pstore::http::server_status,_void>_*)> *
                         )local_2a8);
              std::thread::
              thread<std::packaged_task<void(pstore::maybe<pstore::http::server_status,void>*)>,pstore::maybe<pstore::http::server_status,void>*,void>
                        ((thread *)&local_2c0,
                         (packaged_task<void_(pstore::maybe<pstore::http::server_status,_void>_*)> *
                         )&local_248[0].__data,
                         (maybe<pstore::http::server_status,_void> **)&local_2c8);
              std::thread::detach();
              if (local_2c0._M_state.
                  super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr != (element_type *)0x0) goto LAB_0010edf1;
              std::packaged_task<void_(pstore::maybe<pstore::http::server_status,_void>_*)>::
              ~packaged_task((packaged_task<void_(pstore::maybe<pstore::http::server_status,_void>_*)>
                              *)&local_248[0].__data);
              std::vector<std::future<void>,std::allocator<std::future<void>>>::
              emplace_back<std::future<void>>
                        ((vector<std::future<void>,std::allocator<std::future<void>>> *)this_01.ptr_
                         ,(future<void> *)local_2a8);
              if ((maybe<pstore::http::server_status,_void> *)local_2a8._8_8_ !=
                  (maybe<pstore::http::server_status,_void> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
              }
            }
            if ((opt->playback_path).valid_ == false) {
              if (*(uint *)local_270._16_8_ != 0) {
                uVar14 = 0;
                do {
                  peVar5 = local_288.
                           super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  local_2b0 = local_288.
                              super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi;
                  if (local_288.
                      super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_288.
                       super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_288.
                            super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_288.
                       super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_288.
                            super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  pmVar12 = (maybe<pstore::http::server_status,_void> *)operator_new(0x60);
                  (pmVar12->storage_).__align = (anon_struct_8_0_00000001_for___align)0x100000001;
                  *(undefined ***)pmVar12 = &PTR___Sp_counted_ptr_inplace_001581f0;
                  std::__future_base::_Task_state_base<void()>::
                  _Task_state_base<std::allocator<int>>
                            ((_Task_state_base<void()> *)((pmVar12->storage_).__data + 8),
                             (allocator<int> *)&local_2c0);
                  *(undefined ***)((long)&pmVar12->storage_ + 8) = &PTR___Task_state_00158240;
                  *(uint *)((long)&pmVar12->storage_ + 0x30) = uVar14;
                  *(undefined1 **)(pmVar12 + 1) = local_118;
                  pmVar12[1].storage_.__align = (anon_struct_8_0_00000001_for___align)&local_258;
                  *(element_type **)((long)&pmVar12[1].storage_ + 8) = peVar5;
                  *(undefined8 *)((long)&pmVar12[1].storage_ + 0x10) = local_2b0;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0 !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(_Atomic_word *)(local_2b0 + 8) = *(_Atomic_word *)(local_2b0 + 8) + 1;
                      UNLOCK();
                    }
                    else {
                      *(_Atomic_word *)(local_2b0 + 8) = *(_Atomic_word *)(local_2b0 + 8) + 1;
                    }
                  }
                  local_248[0]._0_8_ =
                       (maybe<pstore::http::server_status,_void> *)((pmVar12->storage_).__data + 8);
                  local_248[0]._8_8_ = pmVar12;
                  std::packaged_task<void_()>::get_future((packaged_task<void_()> *)local_2a8);
                  std::thread::thread<std::packaged_task<void()>,,void>
                            ((thread *)&local_2c0,(packaged_task<void_()> *)&local_248[0].__data);
                  std::thread::detach();
                  if (local_2c0._M_state.
                      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr != (element_type *)0x0) goto LAB_0010edf1;
                  std::packaged_task<void_()>::~packaged_task
                            ((packaged_task<void_()> *)&local_248[0].__data);
                  std::vector<std::future<void>,std::allocator<std::future<void>>>::
                  emplace_back<std::future<void>>
                            ((vector<std::future<void>,std::allocator<std::future<void>>> *)
                             &local_1e8,(future<void> *)local_2a8);
                  if ((maybe<pstore::http::server_status,_void> *)local_2a8._8_8_ !=
                      (maybe<pstore::http::server_status,_void> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._8_8_);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0 !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b0);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 < *(uint *)local_270._16_8_);
              }
            }
            else {
              pbVar10 = pstore::
                        maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        ::operator->(&opt->playback_path);
              pcVar13 = (pbVar10->_M_dataplus)._M_p;
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_158,pcVar13,pcVar13 + pbVar10->_M_string_length);
              pstore::broker::player::player((player *)&local_248[0].__data,&local_158);
              __buf = extraout_RDX;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
                __buf = extraout_RDX_00;
              }
              do {
                pstore::broker::player::read((player *)local_2a8,(int)local_248,__buf,__nbytes);
                uVar4 = local_2a8._0_8_;
                __buf = extraout_RDX_01;
                if ((maybe<pstore::http::server_status,_void> *)local_2a8._0_8_ !=
                    (maybe<pstore::http::server_status,_void> *)0x0) {
                  pstore::broker::command_processor::push_command
                            (local_288.
                             super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,(message_ptr *)local_2a8,local_258);
                  __buf = extraout_RDX_02;
                }
                if ((maybe<pstore::http::server_status,_void> *)local_2a8._0_8_ !=
                    (maybe<pstore::http::server_status,_void> *)0x0) {
                  operator_delete((void *)local_2a8._0_8_,0x100);
                  __buf = extraout_RDX_03;
                }
                uVar7 = local_270._0_8_;
                peVar5 = local_288.
                         super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
              } while ((maybe<pstore::http::server_status,_void> *)uVar4 !=
                       (maybe<pstore::http::server_status,_void> *)0x0);
              local_70.ptr_ = &local_198;
              pstore::gsl::not_null<pstore::maybe<pstore::http::server_status,_void>_*>::
              ensure_invariant(&local_70);
              local_78.ptr_ = (atomic<bool> *)&local_2c9;
              pstore::gsl::not_null<std::atomic<bool>_*>::ensure_invariant(&local_78);
              pstore::broker::shutdown((int)peVar5,(int)uVar7);
              pstore::broker::player::~player((player *)&local_248[0].__data);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._8_8_);
            }
            if (local_288.
                super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_288.
                         super___shared_ptr<pstore::broker::command_processor,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            local_80.ptr_ = "waiting";
            pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_80);
            nVar8.ptr_ = local_80.ptr_;
            pstore::details::log_destinations::__tls_init();
            this_02 = (maybe<pstore::http::server_status,_void> *)
                      local_1e8.
                      super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pmVar12 = (maybe<pstore::http::server_status,_void> *)
                      local_1e8.
                      super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (*(long *)(in_FS_OFFSET + -8) != 0) {
              pstore::details::log_destinations::__tls_init();
              puVar3 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
              for (puVar15 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8);
                  this_02 = (maybe<pstore::http::server_status,_void> *)
                            local_1e8.
                            super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  pmVar12 = (maybe<pstore::http::server_status,_void> *)
                            local_1e8.
                            super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish, puVar15 != puVar3;
                  puVar15 = puVar15 + 1) {
                (**(code **)(*(long *)*puVar15 + 0x48))((long *)*puVar15,5,nVar8.ptr_);
              }
            }
            for (; this_02 != pmVar12;
                this_02 = (maybe<pstore::http::server_status,_void> *)
                          ((this_02->storage_).__data + 8)) {
              if (*(long *)this_02 == 0) {
                pstore::assert_failed
                          ("f.valid ()",
                           "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/brokerd/run_broker.cpp"
                           ,0xe8);
              }
              std::future<void>::get((future<void> *)this_02);
            }
            local_88.ptr_ = "worker threads done: stopping quit thread";
            pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_88);
            nVar8.ptr_ = local_88.ptr_;
            pstore::details::log_destinations::__tls_init();
            if (*(long *)(in_FS_OFFSET + -8) != 0) {
              pstore::details::log_destinations::__tls_init();
              puVar3 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
              for (puVar15 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8); puVar15 != puVar3;
                  puVar15 = puVar15 + 1) {
                (**(code **)(*(long *)*puVar15 + 0x48))((long *)*puVar15,5,nVar8.ptr_);
              }
            }
            pstore::broker::notify_quit_thread();
            std::thread::join();
            local_90.ptr_ = "exiting";
            pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_90);
            nVar8.ptr_ = local_90.ptr_;
            pstore::details::log_destinations::__tls_init();
            if (*(long *)(in_FS_OFFSET + -8) != 0) {
              pstore::details::log_destinations::__tls_init();
              puVar3 = (undefined8 *)(*(undefined8 **)(in_FS_OFFSET + -8))[1];
              for (puVar15 = (undefined8 *)**(undefined8 **)(in_FS_OFFSET + -8); puVar15 != puVar3;
                  puVar15 = puVar15 + 1) {
                (**(code **)(*(long *)*puVar15 + 0x48))((long *)*puVar15,5,nVar8.ptr_);
              }
            }
            iVar9 = pstore::broker::exit_code;
            if (local_198.valid_ == true) {
              local_198._0_8_ = local_198._0_8_ & 0xffffffffffffff00;
            }
            if ((maybe<pstore::http::server_status,_void> *)local_278._M_p ==
                (maybe<pstore::http::server_status,_void> *)0x0) {
              std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                        (&local_1e8);
              pstore::brokerface::fifo_path::~fifo_path((fifo_path *)local_118);
              if (p_Stack_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_250);
              }
              return iVar9;
            }
          }
        }
      }
    }
  }
LAB_0010edf1:
  std::terminate();
}

Assistant:

int run_broker (switches const & opt) {
    using priority = logger::priority;

    threads::set_name ("main");
    create_log_stream ("broker.main");
    log (priority::notice, "broker starting");

#ifdef _WIN32
    wsa_startup startup;
    if (!startup.started ()) {
        throw std::runtime_error ("WSAStartup() failed, broker exited");
    }
#endif // _WIN32

    // If we're recording the messages we receive, then create the file in which they
    // will be stored.
    std::shared_ptr<broker::recorder> record_file;
    if (opt.record_path.has_value ()) {
        record_file = std::make_shared<broker::recorder> (*opt.record_path);
    }

    // TODO: ensure that this is a singleton process?
    log (priority::notice, "opening pipe");

    brokerface::fifo_path fifo{opt.pipe_path.has_value () ? opt.pipe_path->c_str () : nullptr};

    std::vector<std::future<void>> futures;
    std::thread quit;

    maybe<http::server_status> http_status = get_http_server_status (opt.http_port);
    std::atomic<bool> uptime_done{false};

    log (priority::notice, "starting threads");
    {
        auto commands = std::make_shared<broker::command_processor> (
            opt.num_read_threads, &http_status, &uptime_done, opt.scavenge_time);
        auto scav = std::make_shared<broker::scavenger> (commands);
        commands->attach_scavenger (scav);

        quit = create_quit_thread (make_weak (commands), make_weak (scav), opt.num_read_threads,
                                   &http_status, &uptime_done);

        futures = create_worker_threads (commands, fifo, scav, &uptime_done);
        create_http_worker_thread (&futures, &http_status, opt.announce_http_port);

        if (opt.playback_path.has_value ()) {
            broker::player playback_file (*opt.playback_path);
            while (auto msg = playback_file.read ()) {
                commands->push_command (std::move (msg), record_file.get ());
            }
            shutdown (commands.get (), scav.get (), -1 /*signum*/, 0U /*num read threads*/,
                      &http_status, &uptime_done);
        } else {
            for (auto ctr = 0U; ctr < opt.num_read_threads; ++ctr) {
                futures.push_back (create_thread ([ctr, &fifo, &record_file, commands] () {
                    auto const name = "read"s + std::to_string (ctr);
                    threads::set_name (name.c_str ());
                    create_log_stream ("broker." + name);
                    read_loop (fifo, record_file, commands);
                }));
            }
        }
    }

    log (priority::notice, "waiting");
    for (auto & f : futures) {
        PSTORE_ASSERT (f.valid ());
        f.get ();
    }
    log (priority::notice, "worker threads done: stopping quit thread");
    broker::notify_quit_thread ();
    quit.join ();
    log (priority::notice, "exiting");
    return broker::exit_code;
}